

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvtable.cc
# Opt level: O2

vector<board::Move,_std::allocator<board::Move>_> * __thiscall
search::PVTable::getPV
          (vector<board::Move,_std::allocator<board::Move>_> *__return_storage_ptr__,PVTable *this,
          Board *pos)

{
  int iVar1;
  Move in_RAX;
  int iVar2;
  bool bVar3;
  Move move;
  
  iVar1 = pos->ply;
  (__return_storage_ptr__->super__Vector_base<board::Move,_std::allocator<board::Move>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<board::Move,_std::allocator<board::Move>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<board::Move,_std::allocator<board::Move>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar2 = 0x40;
  move = in_RAX;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    move = getMove(this,pos);
    if (move.value == 0) break;
    bVar3 = board::makemove::move(&move,pos);
    if (!bVar3) break;
    std::vector<board::Move,_std::allocator<board::Move>_>::push_back(__return_storage_ptr__,&move);
  }
  while (iVar1 < pos->ply) {
    board::makemove::undo(pos);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<board::Move> search::PVTable::getPV(board::Board& pos)
{
    int originalPly = pos.getPly();
    std::vector<board::Move> pv;
    for (int i = 0; i < 64; i++) {
        board::Move move = getMove(pos);
        if (move.getValue() != 0 && board::makemove::move(move, pos)) {
            pv.push_back(move);
        }
        else {
            break;
        }
    }
    while (pos.getPly() > originalPly) {
        board::makemove::undo(pos);
    }
    return pv;
}